

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

string * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ParsedInternalKey *this)

{
  char *pcVar1;
  ostream *poVar2;
  Slice *value;
  ostringstream ss;
  undefined1 *local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [16];
  string local_1d0;
  undefined1 *local_1b0;
  undefined8 uStack_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1d0._M_dataplus._M_p._0_1_ = 0x27;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)&local_1d0,1);
  pcVar1 = (this->user_key).data_;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,pcVar1,pcVar1 + (this->user_key).size_);
  local_1b0 = local_1f0;
  uStack_1a8 = uStack_1e8;
  EscapeString_abi_cxx11_(&local_1d0,(leveldb *)&local_1b0,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                              local_1d0._M_dataplus._M_p._0_1_),
                      local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' @ ",4);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
  std::ostream::operator<<(poVar2,this->type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
      &local_1d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_));
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
  std::ostringstream ss;
  ss << '\'' << EscapeString(user_key.ToString()) << "' @ " << sequence << " : "
     << static_cast<int>(type);
  return ss.str();
}